

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

int sysbvm_type_computeDepth(sysbvm_tuple_t type)

{
  int iVar1;
  
  iVar1 = -1;
  while (type != 0) {
    type = sysbvm_type_getSupertype(type);
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

SYSBVM_API int sysbvm_type_computeDepth(sysbvm_tuple_t type)
{
    if(!type)
        return -1;

    return sysbvm_type_computeDepth(sysbvm_type_getSupertype(type)) + 1;
}